

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  Index IVar1;
  Index in_RDI;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *unaff_retaddr;
  Index inner;
  Index outer;
  undefined8 local_18;
  long lVar2;
  long inner_00;
  
  lVar2 = 0;
  while( true ) {
    inner_00 = lVar2;
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
            ::outerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)0x1452a6);
    if (IVar1 <= lVar2) break;
    local_18 = 0;
    while( true ) {
      IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
              ::innerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)0x1452cf);
      if (IVar1 <= local_18) break;
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeffByOuterInner(unaff_retaddr,in_RDI,inner_00);
      local_18 = local_18 + 1;
    }
    lVar2 = inner_00 + 1;
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }